

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzsbndmat.cpp
# Opt level: O2

int __thiscall
TPZSBMatrix<std::complex<float>_>::Subst_Diag
          (TPZSBMatrix<std::complex<float>_> *this,TPZFMatrix<std::complex<float>_> *B)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  int64_t j;
  long lVar2;
  int64_t k;
  long lVar3;
  complex<float> local_48;
  complex<float> local_40;
  undefined1 local_38 [8];
  
  lVar3 = (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fRow;
  iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
            _vptr_TPZSavable[0xc])();
  if ((lVar3 != CONCAT44(extraout_var,iVar1)) ||
     ((this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fDecomposed == '\0')) {
    TPZMatrix<std::complex<float>_>::Error
              ("virtual int TPZSBMatrix<std::complex<float>>::Subst_Diag(TPZFMatrix<TVar> *) const [TVar = std::complex<float>]"
               ,"Subst_Diag-> uncompatible matrices");
  }
  lVar3 = 0;
  while( true ) {
    iVar1 = (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
              _vptr_TPZSavable[0xc])(this);
    if (CONCAT44(extraout_var_00,iVar1) <= lVar3) break;
    for (lVar2 = 0; lVar2 < (B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.fCol;
        lVar2 = lVar2 + 1) {
      (*(B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(B,lVar3,lVar2);
      (*(this->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x24])(this,lVar3,lVar3);
      std::operator/(&local_40,&local_48);
      (*(B->super_TPZMatrix<std::complex<float>_>).super_TPZBaseMatrix.super_TPZSavable.
        _vptr_TPZSavable[0x23])(B,lVar3,lVar2,local_38);
    }
    lVar3 = lVar3 + 1;
  }
  return 1;
}

Assistant:

int TPZSBMatrix<TVar>::Subst_Diag( TPZFMatrix<TVar> *B ) const
{
    
    if ( (B->Rows() != this->Dim()) || !this->fDecomposed )
       this->Error(__PRETTY_FUNCTION__,"Subst_Diag-> uncompatible matrices") ;
    
    
    int64_t size = fBand + 1;
    for ( int64_t k = 0; k < this->Dim(); k++ )
        for ( int64_t j = 0; j < B->Cols(); j++ )
            B->PutVal( k, j, B->GetVal( k, j) / GetVal(k,k) );
    
    return( 1 );
}